

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_http_request.cc
# Opt level: O2

int __thiscall AliHttpRequest::CommitRequest(AliHttpRequest *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  size_type sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  AliTlsConnection *this_01;
  long lVar8;
  AliTcpConnection *this_02;
  bool with_query;
  string *psVar9;
  _Self __tmp;
  string path;
  string req;
  string host;
  string local_90;
  char *local_70 [4];
  string local_50;
  
  bVar2 = std::operator==(&this->method_,"POST");
  with_query = true;
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&path,"Content-Length",(allocator<char> *)&req);
    this_00 = &this->map_request_headers_;
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&path);
    sVar1 = (this->query_)._M_string_length;
    std::__cxx11::string::~string((string *)&path);
    if (((_Rb_tree_header *)iVar5._M_node ==
         &(this->map_request_headers_)._M_t._M_impl.super__Rb_tree_header) && (sVar1 != 0)) {
      get_format_string_abi_cxx11_(&path,"%d",(this->query_)._M_string_length);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&req,"Content-Length",(allocator<char> *)&host);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,&req);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)&path);
      std::__cxx11::string::~string((string *)&req);
      std::__cxx11::string::~string((string *)&path);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&path,"Content-Type",(allocator<char> *)&req);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,&path);
      std::__cxx11::string::assign((char *)pmVar6);
      std::__cxx11::string::~string((string *)&path);
      with_query = false;
    }
  }
  GetPath_abi_cxx11_(&path,this,with_query);
  get_format_string_abi_cxx11_
            (&req,"%s %s HTTP/1.1\r\n",(this->method_)._M_dataplus._M_p,path._M_dataplus._M_p);
  for (p_Var7 = (this->map_request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &(this->map_request_headers_)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    append_format_string(&req,"%s: %s\r\n",*(undefined8 *)(p_Var7 + 1),*(undefined8 *)(p_Var7 + 2));
  }
  std::__cxx11::string::append((char *)&req);
  if (this->is_tls == true) {
    this_01 = (AliTlsConnection *)operator_new(0xb08);
    std::__cxx11::string::string((string *)&local_50,(string *)&this->host_);
    iVar3 = atoi((this->port_)._M_dataplus._M_p);
    AliTlsConnection::AliTlsConnection(this_01,&local_50,iVar3);
    this->connection_ = (AliConnection *)this_01;
    psVar9 = &local_50;
  }
  else {
    std::__cxx11::string::string((string *)&host,(string *)&this->host_);
    iVar3 = atoi((this->port_)._M_dataplus._M_p);
    if ((this->proxy_host_)._M_string_length != 0) {
      psVar9 = &this->proxy_host_;
      lVar8 = std::__cxx11::string::find((char *)psVar9,0x1706a1);
      if (lVar8 == -1) {
        std::__cxx11::string::_M_assign((string *)&host);
        iVar3 = 0x50;
      }
      else {
        std::__cxx11::string::substr((ulong)local_70,(ulong)psVar9);
        std::__cxx11::string::operator=((string *)&host,(string *)local_70);
        std::__cxx11::string::~string((string *)local_70);
        std::__cxx11::string::substr((ulong)local_70,(ulong)psVar9);
        iVar3 = atoi(local_70[0]);
        std::__cxx11::string::~string((string *)local_70);
      }
    }
    this_02 = (AliTcpConnection *)operator_new(0x38);
    std::__cxx11::string::string((string *)&local_90,(string *)&host);
    AliTcpConnection::AliTcpConnection(this_02,&local_90,iVar3);
    this->connection_ = (AliConnection *)this_02;
    std::__cxx11::string::~string((string *)&local_90);
    psVar9 = &host;
  }
  std::__cxx11::string::~string((string *)psVar9);
  iVar4 = (**this->connection_->_vptr_AliConnection)();
  iVar3 = -1;
  if (((iVar4 == 0) &&
      (iVar4 = (*this->connection_->_vptr_AliConnection[1])
                         (this->connection_,req._M_dataplus._M_p,(ulong)(uint)req._M_string_length),
      0 < iVar4)) &&
     ((bVar2 = std::operator==(&this->method_,"POST"), !bVar2 ||
      (((this->query_)._M_string_length == 0 ||
       (iVar4 = (*this->connection_->_vptr_AliConnection[1])
                          (this->connection_,(this->query_)._M_dataplus._M_p), 0 < iVar4)))))) {
    iVar3 = 0;
  }
  std::__cxx11::string::~string((string *)&req);
  std::__cxx11::string::~string((string *)&path);
  return iVar3;
}

Assistant:

int AliHttpRequest::CommitRequest() {
  bool with_query = true;  

  // if content-length is not setted, we assume no body
  // put the query into body,and add Content-Type header
  if(this->method_ == "POST" 
     && this->map_request_headers_.find("Content-Length") == this->map_request_headers_.end()
     && this->query_.size() > 0) {
    with_query = false;
    this->map_request_headers_["Content-Length"] = get_format_string("%d", this->query_.size());
    this->map_request_headers_["Content-Type"] = "application/x-www-form-urlencoded";
  }
  std::string path = GetPath(with_query); 

  std::string req = get_format_string("%s %s HTTP/1.1\r\n", this->method_.c_str(),  path.c_str());
  for(std::map<std::string, std::string>::iterator it = map_request_headers_.begin();
      it != map_request_headers_.end(); it++) {
    append_format_string(req, "%s: %s\r\n", it->first.c_str(), it->second.c_str());
  }
  req.append("\r\n");

  ALI_LOG("request=\n%s", req.c_str());

  if(this->is_tls) {
    connection_ = new AliTlsConnection(this->host_, atoi(this->port_.c_str()));
  } else {
    std::string host = this->host_;
    int port = atoi(this->port_.c_str());
    if(!this->proxy_host_.empty()) {
        size_t pos = this->proxy_host_.find(":");
        if(pos == std::string::npos) {
          host = this->proxy_host_;
          port = 80;
        } else {
          host = this->proxy_host_.substr(0, pos);
          port = atoi(this->proxy_host_.substr(pos + 1, this->proxy_host_.size() - pos - 1).c_str());
        }
    }
    ALI_LOG("host=%s,port=%d", host.c_str(), port);
    connection_ = new AliTcpConnection(host, port);
  }

  if(connection_->Connect() != 0) {
    return -1;
  }

  if(connection_->Send((char*)req.c_str(), req.size()) <= 0) {
    return -1;
  }
  if(this->method_ == "POST" && this->query_.size() > 0) {
     if(connection_->Send((char*)this->query_.c_str(), this->query_.size()) <= 0) {
      return -1;
    }
  }
  return 0;
}